

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.hpp
# Opt level: O2

void __thiscall
rsg::VariableAccess::tokenize(VariableAccess *this,GeneratorState *state,TokenStream *str)

{
  Token local_20;
  
  Token::Token(&local_20,(this->m_variable->m_name)._M_dataplus._M_p);
  TokenStream::operator<<(str,&local_20);
  Token::~Token(&local_20);
  return;
}

Assistant:

void						tokenize			(GeneratorState& state, TokenStream& str) const	{ DE_UNREF(state); str << Token(m_variable->getName());	}